

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefFuncConst(TranslateToFuzzReader *this,Type type)

{
  pointer puVar1;
  Type TVar2;
  Module *module;
  undefined1 auVar3 [16];
  char cVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar10;
  byte *pbVar11;
  undefined8 *puVar12;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var13;
  HeapType HVar14;
  ulong uVar15;
  long extraout_RDX;
  pointer puVar16;
  Name NVar17;
  Name name;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_88;
  byte local_70;
  undefined8 local_68;
  char *pcStack_60;
  Type local_50;
  Type type_local;
  HeapType heapType;
  Function *local_38;
  TypeBuilder builder;
  
  local_50.id = type.id;
  type_local.id = (uintptr_t)Type::getHeapType(&local_50);
  iVar5 = wasm::HeapType::getShared();
  if (type_local.id < 0x7d) {
    if (((uint)type_local.id & 0x7b) != 0x10) {
      __assert_fail("heapType.getBasic(Unshared) == HeapType::func",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xcff,"Expression *wasm::TranslateToFuzzReader::makeRefFuncConst(Type)");
    }
    if (((this->funcContext != (FunctionCreationContext *)0x0) &&
        (iVar6 = wasm::HeapType::getShared(), iVar6 == iVar5)) &&
       (uVar7 = Random::upTo(&this->random,4), uVar7 != 0)) {
      _Var13._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)this->funcContext->func;
LAB_0014df2f:
      local_68 = *(undefined8 *)
                  _Var13._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcStack_60 = *(char **)((long)_Var13._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8
                             );
      goto LAB_0014df3a;
    }
  }
  puVar16 = (this->wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar16 != puVar1) {
    uVar7 = Random::upTo(&this->random,(uint32_t)((ulong)((long)puVar1 - (long)puVar16) >> 3));
    uVar15 = (ulong)uVar7;
    puVar16 = (this->wasm->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      TVar2.id = *(uintptr_t *)
                  ((long)puVar16[uVar15 & 0xffffffff]._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                  + 0x38);
      if (((uint)(0x7c < TVar2.id) * 4 + 3 & (uint)TVar2.id) != 0) {
        __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
      }
      cVar4 = wasm::Type::isSubType(TVar2,local_50);
      if (cVar4 != '\0') {
        _Var13._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             puVar16[uVar15 & 0xffffffff]._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
        goto LAB_0014df2f;
      }
      puVar16 = (this->wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)(this->wasm->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar16 >> 3;
      auVar3 = ZEXT416((int)uVar15 + 1) % auVar3;
      uVar15 = auVar3._0_8_;
    } while (uVar7 != auVar3._0_4_);
  }
  if (((((uint)local_50.id & 3) == 2 && 6 < local_50.id) &&
      (uVar7 = Random::upTo(&this->random,2), uVar7 == 0)) ||
     (((local_50.id & 3) == 0 && 6 < local_50.id &&
      ((uVar7 = Random::upTo(&this->random,0x10), uVar7 == 0 &&
       (this->funcContext != (FunctionCreationContext *)0x0)))))) {
    pEVar8 = (Expression *)
             Builder::makeRefNull(&this->builder,(HeapType)((ulong)(iVar5 == 0) * 4 + 0x68));
    if (6 < local_50.id && ((uint)local_50.id & 3) == 2) {
      return pEVar8;
    }
    if (this->funcContext != (FunctionCreationContext *)0x0) {
      pEVar9 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
      (((SpecificExpression<(wasm::Expression::Id)41> *)&pEVar9->_id)->super_Expression)._id =
           RefAsId;
      (pEVar9->type).id = 0;
      *(undefined4 *)(pEVar9 + 1) = 0;
      pEVar9[1].type.id = (uintptr_t)pEVar8;
      wasm::RefAs::finalize();
      return pEVar9;
    }
    __assert_fail("funcContext",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xd1d,"Expression *wasm::TranslateToFuzzReader::makeRefFuncConst(Type)");
  }
  if (type_local.id < 0x7d) {
    wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_38,1);
    wasm::TypeBuilder::setHeapType((ulong)&local_38,(Signature)ZEXT816(0));
    wasm::TypeBuilder::setShared((ulong)&local_38,Shared);
    wasm::TypeBuilder::build();
    pvVar10 = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)&local_88._M_first);
    type_local.id =
         ((pvVar10->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
          super__Vector_impl_data._M_start)->id;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[local_70]._M_data)
              ((anon_class_1_0_00000001 *)((long)&heapType.id + 7),
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&local_88._M_first);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_38);
  }
  wasm::HeapType::getSignature();
  pbVar11 = (byte *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x10,8);
  *pbVar11 = extraout_RDX != 0 | 0x16;
  *(ulong *)(pbVar11 + 8) = (ulong)(extraout_RDX != 0);
  module = this->wasm;
  NVar17.super_IString.str = (IString)wasm::IString::interned(0xf,"ref_func_target",0);
  NVar17 = Names::getValidFunctionName(module,NVar17);
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0;
  name.super_IString.str._M_str = NVar17.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (name,(HeapType)NVar17.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)type_local.id,
             (Expression *)&local_88._M_first);
  puVar12 = (undefined8 *)wasm::Module::addFunction((unique_ptr *)module);
  if (local_38 != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_38,local_38);
  }
  local_38 = (Function *)0x0;
  if ((void *)local_88._0_8_ != (void *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  local_68 = *puVar12;
  pcStack_60 = (char *)puVar12[1];
LAB_0014df3a:
  HVar14.id = (uintptr_t)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  *(undefined1 *)HVar14.id = 0x2b;
  *(undefined8 *)(HVar14.id + 8) = 0;
  *(undefined8 *)(HVar14.id + 0x10) = local_68;
  *(char **)(HVar14.id + 0x18) = pcStack_60;
  wasm::RefFunc::finalize(HVar14);
  return (Expression *)HVar14.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefFuncConst(Type type) {
  auto heapType = type.getHeapType();
  auto share = heapType.getShared();
  if (heapType.isBasic()) {
    assert(heapType.getBasic(Unshared) == HeapType::func);
    // With high probability, use the last created function if possible.
    // Otherwise, continue on to select some other function.
    if (funcContext && funcContext->func->type.getShared() == share &&
        !oneIn(4)) {
      auto* target = funcContext->func;
      return builder.makeRefFunc(target->name, target->type);
    }
  }
  // Look for a proper function starting from a random location, and loop from
  // there, wrapping around to 0.
  if (!wasm.functions.empty()) {
    Index start = upTo(wasm.functions.size());
    Index i = start;
    do {
      auto& func = wasm.functions[i];
      if (Type::isSubType(Type(func->type, NonNullable), type)) {
        return builder.makeRefFunc(func->name, func->type);
      }
      i = (i + 1) % wasm.functions.size();
    } while (i != start);
  }
  // We don't have a matching function. Create a null some of the time here,
  // but only rarely if the type is non-nullable (because in that case we'd need
  // to add a ref.as_non_null to validate, and the code will trap when we get
  // here).
  if ((type.isNullable() && oneIn(2)) ||
      (type.isNonNullable() && oneIn(16) && funcContext)) {
    Expression* ret = builder.makeRefNull(HeapTypes::nofunc.getBasic(share));
    if (!type.isNullable()) {
      assert(funcContext);
      ret = builder.makeRefAs(RefAsNonNull, ret);
    }
    return ret;
  }
  // As a final option, create a new function with the correct signature. If it
  // returns a value, write a trap as we do not want to create any more code
  // here (we might end up recursing). Note that a trap in the function lets us
  // execute more code then the ref.as_non_null path just before us, which traps
  // even if we never call the function.
  if (heapType.isBasic()) {
    // We need a specific signature type to create a function. Pick an arbitrary
    // signature if we only had generic 'func' here.
    TypeBuilder builder(1);
    builder[0] = Signature(Type::none, Type::none);
    builder[0].setShared(share);
    heapType = (*builder.build())[0];
  }
  auto* body = heapType.getSignature().results == Type::none
                 ? (Expression*)builder.makeNop()
                 : (Expression*)builder.makeUnreachable();
  auto* func = wasm.addFunction(builder.makeFunction(
    Names::getValidFunctionName(wasm, "ref_func_target"), heapType, {}, body));
  return builder.makeRefFunc(func->name, heapType);
}